

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

void __thiscall gmath::DMatrix<double>::DMatrix(DMatrix<double> *this,DMatrix<double> *a)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  DMatrix<double> *in_RSI;
  int *in_RDI;
  int i;
  int local_14;
  
  iVar2 = rows(in_RSI);
  *in_RDI = iVar2;
  iVar2 = cols(in_RSI);
  in_RDI[1] = iVar2;
  in_RDI[2] = *in_RDI * in_RDI[1];
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  if (0 < in_RDI[2]) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)in_RDI[2];
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(in_RDI + 4) = pvVar4;
    for (local_14 = 0; local_14 < in_RDI[2]; local_14 = local_14 + 1) {
      *(double *)(*(long *)(in_RDI + 4) + (long)local_14 * 8) = in_RSI->v[local_14];
    }
  }
  return;
}

Assistant:

DMatrix(const DMatrix<T> &a)
    {
      nrows=a.rows();
      ncols=a.cols();
      n=nrows*ncols;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=a.v[i];
        }
      }
    }